

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O1

int run_test_fs_poll_close_request(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  uv_loop_t *puVar3;
  uv_loop_t *loop_00;
  code *unaff_RBX;
  uint uVar4;
  ulong unaff_RBP;
  char *unaff_R14;
  uv_fs_poll_t *unaff_R15;
  uv_fs_poll_t *puVar5;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  uv_fs_poll_t uStack_f38;
  uv_loop_t uStack_ed0;
  uv_loop_t *puStack_b80;
  undefined1 auStack_b78 [952];
  uv_loop_t *puStack_7c0;
  char *pcStack_7b8;
  undefined1 *puStack_7b0;
  code *pcStack_7a8;
  uv_fs_poll_t uStack_7a0;
  uv_loop_t uStack_738;
  uv_loop_t *puStack_3e8;
  uv_fs_poll_t local_3c0;
  uv_loop_t local_358;
  
  remove("testfile");
  iVar1 = uv_loop_init(&local_358);
  if (iVar1 == 0) {
    iVar1 = uv_fs_poll_init(&local_358,&local_3c0);
    if (iVar1 != 0) goto LAB_0014fba5;
    iVar1 = uv_fs_poll_start(&local_3c0,poll_cb_fail,"testfile",100);
    if (iVar1 != 0) goto LAB_0014fbaa;
    uv_close((uv_handle_t *)&local_3c0,close_cb);
    unaff_RBX = (code *)&local_358;
    while (close_cb_called == 0) {
      uv_run((uv_loop_t *)unaff_RBX,UV_RUN_ONCE);
    }
    if (close_cb_called != 1) {
      run_test_fs_poll_close_request_cold_6();
      goto LAB_0014fba0;
    }
    iVar1 = uv_loop_close(&local_358);
    if (iVar1 != 0) goto LAB_0014fbaf;
    unaff_RBX = (code *)uv_default_loop();
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_0014fba0:
    run_test_fs_poll_close_request_cold_1();
LAB_0014fba5:
    run_test_fs_poll_close_request_cold_2();
LAB_0014fbaa:
    run_test_fs_poll_close_request_cold_3();
LAB_0014fbaf:
    run_test_fs_poll_close_request_cold_4();
  }
  run_test_fs_poll_close_request_cold_5();
  puVar5 = &uStack_7a0;
  pcStack_7a8 = (code *)0x14fbd2;
  puStack_3e8 = (uv_loop_t *)unaff_RBX;
  remove("testfile");
  pcStack_7a8 = (code *)0x14fbdc;
  iVar1 = uv_loop_init(&uStack_738);
  if (iVar1 == 0) {
    pcStack_7a8 = (code *)0x14fbf1;
    iVar1 = uv_fs_poll_init(&uStack_738,&uStack_7a0);
    if (iVar1 != 0) goto LAB_0014fcd6;
    unaff_RBP = 10;
    unaff_RBX = poll_cb_fail;
    unaff_R14 = "testfile";
    do {
      pcStack_7a8 = (code *)0x14fc22;
      iVar1 = uv_fs_poll_start(&uStack_7a0,poll_cb_fail,"testfile",100);
      if (iVar1 != 0) {
LAB_0014fcc7:
        pcStack_7a8 = (code *)0x14fccc;
        run_test_fs_poll_close_request_multi_start_stop_cold_3();
        goto LAB_0014fccc;
      }
      pcStack_7a8 = (code *)0x14fc32;
      iVar1 = uv_fs_poll_stop(&uStack_7a0);
      if (iVar1 != 0) {
        pcStack_7a8 = (code *)0x14fcc7;
        run_test_fs_poll_close_request_multi_start_stop_cold_4();
        goto LAB_0014fcc7;
      }
      uVar4 = (int)unaff_RBP - 1;
      unaff_RBP = (ulong)uVar4;
    } while (uVar4 != 0);
    pcStack_7a8 = (code *)0x14fc4d;
    uv_close((uv_handle_t *)&uStack_7a0,close_cb);
    unaff_RBX = (code *)&uStack_738;
    while (close_cb_called == 0) {
      pcStack_7a8 = (code *)0x14fc69;
      uv_run((uv_loop_t *)unaff_RBX,UV_RUN_ONCE);
    }
    if (close_cb_called != 1) {
LAB_0014fccc:
      pcStack_7a8 = (code *)0x14fcd1;
      run_test_fs_poll_close_request_multi_start_stop_cold_7();
      unaff_R15 = &uStack_7a0;
      goto LAB_0014fcd1;
    }
    pcStack_7a8 = (code *)0x14fc7a;
    iVar1 = uv_loop_close(&uStack_738);
    if (iVar1 != 0) goto LAB_0014fcdb;
    pcStack_7a8 = (code *)0x14fc83;
    unaff_RBX = (code *)uv_default_loop();
    pcStack_7a8 = (code *)0x14fc97;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_7a8 = (code *)0x14fca1;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    pcStack_7a8 = (code *)0x14fca6;
    puVar3 = uv_default_loop();
    pcStack_7a8 = (code *)0x14fcae;
    iVar1 = uv_loop_close(puVar3);
    puVar5 = &uStack_7a0;
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_0014fcd1:
    pcStack_7a8 = (code *)0x14fcd6;
    run_test_fs_poll_close_request_multi_start_stop_cold_1();
LAB_0014fcd6:
    puVar5 = unaff_R15;
    pcStack_7a8 = (code *)0x14fcdb;
    run_test_fs_poll_close_request_multi_start_stop_cold_2();
LAB_0014fcdb:
    pcStack_7a8 = (code *)0x14fce0;
    run_test_fs_poll_close_request_multi_start_stop_cold_5();
  }
  pcStack_7a8 = run_test_fs_poll_close_request_multi_stop_start;
  run_test_fs_poll_close_request_multi_start_stop_cold_6();
  puVar3 = (uv_loop_t *)auStack_b78;
  puStack_b80 = (uv_loop_t *)0x14fcfe;
  puStack_7c0 = (uv_loop_t *)unaff_RBX;
  pcStack_7b8 = unaff_R14;
  puStack_7b0 = (undefined1 *)puVar5;
  pcStack_7a8 = (code *)unaff_RBP;
  remove("testfile");
  puStack_b80 = (uv_loop_t *)0x14fd08;
  iVar1 = uv_loop_init((uv_loop_t *)(auStack_b78 + 0x68));
  if (iVar1 == 0) {
    puStack_b80 = (uv_loop_t *)0x14fd1d;
    iVar1 = uv_fs_poll_init((uv_loop_t *)(auStack_b78 + 0x68),(uv_fs_poll_t *)auStack_b78);
    if (iVar1 != 0) goto LAB_0014fe02;
    iVar1 = 10;
    do {
      puStack_b80 = (uv_loop_t *)0x14fd43;
      iVar2 = uv_fs_poll_stop((uv_fs_poll_t *)auStack_b78);
      if (iVar2 != 0) {
LAB_0014fdf3:
        puStack_b80 = (uv_loop_t *)0x14fdf8;
        run_test_fs_poll_close_request_multi_stop_start_cold_3();
        goto LAB_0014fdf8;
      }
      puStack_b80 = (uv_loop_t *)0x14fd5e;
      iVar2 = uv_fs_poll_start((uv_fs_poll_t *)auStack_b78,poll_cb_fail,"testfile",100);
      if (iVar2 != 0) {
        puStack_b80 = (uv_loop_t *)0x14fdf3;
        run_test_fs_poll_close_request_multi_stop_start_cold_4();
        goto LAB_0014fdf3;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    puStack_b80 = (uv_loop_t *)0x14fd79;
    uv_close((uv_handle_t *)auStack_b78,close_cb);
    puVar3 = (uv_loop_t *)(auStack_b78 + 0x68);
    while (close_cb_called == 0) {
      puStack_b80 = (uv_loop_t *)0x14fd95;
      uv_run(puVar3,UV_RUN_ONCE);
    }
    if (close_cb_called != 1) {
LAB_0014fdf8:
      puStack_b80 = (uv_loop_t *)0x14fdfd;
      run_test_fs_poll_close_request_multi_stop_start_cold_7();
      unaff_RBX = (code *)puVar3;
      goto LAB_0014fdfd;
    }
    puStack_b80 = (uv_loop_t *)0x14fda6;
    iVar1 = uv_loop_close((uv_loop_t *)(auStack_b78 + 0x68));
    if (iVar1 != 0) goto LAB_0014fe07;
    puStack_b80 = (uv_loop_t *)0x14fdaf;
    puVar3 = uv_default_loop();
    puStack_b80 = (uv_loop_t *)0x14fdc3;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_b80 = (uv_loop_t *)0x14fdcd;
    uv_run(puVar3,UV_RUN_DEFAULT);
    puStack_b80 = (uv_loop_t *)0x14fdd2;
    loop_00 = uv_default_loop();
    puStack_b80 = (uv_loop_t *)0x14fdda;
    iVar1 = uv_loop_close(loop_00);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_0014fdfd:
    puStack_b80 = (uv_loop_t *)0x14fe02;
    run_test_fs_poll_close_request_multi_stop_start_cold_1();
LAB_0014fe02:
    puVar3 = (uv_loop_t *)unaff_RBX;
    puStack_b80 = (uv_loop_t *)0x14fe07;
    run_test_fs_poll_close_request_multi_stop_start_cold_2();
LAB_0014fe07:
    puStack_b80 = (uv_loop_t *)0x14fe0c;
    run_test_fs_poll_close_request_multi_stop_start_cold_5();
  }
  puStack_b80 = (uv_loop_t *)run_test_fs_poll_close_request_stop_when_active;
  run_test_fs_poll_close_request_multi_stop_start_cold_6();
  puStack_b80 = puVar3;
  remove("testfile");
  iVar1 = uv_loop_init(&uStack_ed0);
  if (iVar1 == 0) {
    iVar1 = uv_fs_poll_init(&uStack_ed0,&uStack_f38);
    if (iVar1 != 0) goto LAB_0014ff1f;
    iVar1 = uv_fs_poll_start(&uStack_f38,poll_cb_noop,"testfile",100);
    if (iVar1 != 0) goto LAB_0014ff24;
    uv_run(&uStack_ed0,UV_RUN_ONCE);
    iVar1 = uv_fs_poll_stop(&uStack_f38);
    if (iVar1 != 0) goto LAB_0014ff29;
    uv_run(&uStack_ed0,UV_RUN_ONCE);
    uv_close((uv_handle_t *)&uStack_f38,close_cb);
    uv_run(&uStack_ed0,UV_RUN_ONCE);
    if (close_cb_called != 1) goto LAB_0014ff2e;
    iVar1 = uv_loop_close(&uStack_ed0);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014ff38;
    }
  }
  else {
    run_test_fs_poll_close_request_stop_when_active_cold_1();
LAB_0014ff1f:
    run_test_fs_poll_close_request_stop_when_active_cold_2();
LAB_0014ff24:
    run_test_fs_poll_close_request_stop_when_active_cold_3();
LAB_0014ff29:
    run_test_fs_poll_close_request_stop_when_active_cold_4();
LAB_0014ff2e:
    run_test_fs_poll_close_request_stop_when_active_cold_5();
  }
  run_test_fs_poll_close_request_stop_when_active_cold_6();
LAB_0014ff38:
  run_test_fs_poll_close_request_stop_when_active_cold_7();
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_poll_close_request) {
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;

  remove(FIXTURE);

  ASSERT(0 == uv_loop_init(&loop));

  ASSERT(0 == uv_fs_poll_init(&loop, &poll_handle));
  ASSERT(0 == uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  while (close_cb_called == 0)
    uv_run(&loop, UV_RUN_ONCE);
  ASSERT(close_cb_called == 1);

  ASSERT(0 == uv_loop_close(&loop));

  MAKE_VALGRIND_HAPPY();
  return 0;
}